

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyPureVector.h
# Opt level: O1

void __thiscall
JointPolicyPureVector::JointPolicyPureVector(JointPolicyPureVector *this,I_PtPDpure_constPtr *pu)

{
  PolicyDomainCategory PVar1;
  
  PVar1 = (**(code **)(*(long *)pu->px + 0x40))();
  JointPolicyDiscretePure::JointPolicyDiscretePure
            ((JointPolicyDiscretePure *)this,(shared_ptr *)pu,PVar1);
  PVar1 = (**(code **)(*(long *)pu->px + 0x40))();
  JPolComponent_VectorImplementation::JPolComponent_VectorImplementation
            ((JPolComponent_VectorImplementation *)(this + 0x38),(shared_ptr *)pu,PVar1,999999);
  *(code **)this = Timing::Start;
  *(code **)(this + 0x38) = memmove;
  *(undefined8 *)(this + 0x80) = 0;
  *(undefined8 *)(this + 0x88) = 0;
  *(undefined8 *)(this + 0x90) = 0;
  return;
}

Assistant:

JointPolicyPureVector(I_PtPDpure_constPtr pu)
          :
          JointPolicyDiscretePure( pu , pu->GetDefaultIndexDomCat()  ),
          JPolComponent_VectorImplementation(pu,  pu->GetDefaultIndexDomCat() )
        {}